

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scripthash.cpp
# Opt level: O0

void __thiscall ScriptHash_ScriptHash_hex_Test::TestBody(ScriptHash_ScriptHash_hex_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_a8;
  Message local_a0;
  string local_98;
  undefined1 local_78 [8];
  AssertionResult gtest_ar;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  ScriptHash script_hash;
  ScriptHash_ScriptHash_hex_Test *this_local;
  
  script_hash.script_hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_50,
             "002016a2aa44989dab00f6c54dfc682ec482a0a061d289fd5ac39354c8dffed59ddf",&local_51);
  cfd::core::ScriptHash::ScriptHash((ScriptHash *)local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  cfd::core::ScriptHash::GetHex_abi_cxx11_(&local_98,(ScriptHash *)local_30);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_78,"script_hash.GetHex().c_str()",
             "\"002016a2aa44989dab00f6c54dfc682ec482a0a061d289fd5ac39354c8dffed59ddf\"",pcVar2,
             "002016a2aa44989dab00f6c54dfc682ec482a0a061d289fd5ac39354c8dffed59ddf");
  std::__cxx11::string::~string((string *)&local_98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_scripthash.cpp"
               ,0x13,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  cfd::core::ScriptHash::~ScriptHash((ScriptHash *)local_30);
  return;
}

Assistant:

TEST(ScriptHash, ScriptHash_hex) {
  ScriptHash script_hash(
      "002016a2aa44989dab00f6c54dfc682ec482a0a061d289fd5ac39354c8dffed59ddf");
  EXPECT_STREQ(
      script_hash.GetHex().c_str(),
      "002016a2aa44989dab00f6c54dfc682ec482a0a061d289fd5ac39354c8dffed59ddf");
}